

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

void __thiscall BlockDevice::Unlock(BlockDevice *this)

{
  BlockDevice *this_local;
  
  return;
}

Assistant:

void BlockDevice::Unlock()
{
#ifdef _WIN32
    DWORD dwRet;

    // Anything to unlock?
    if (lLockHandles.size())
    {
        for (auto p : lLockHandles)
        {
            if (p.first != INVALID_HANDLE_VALUE)
                CloseHandle(p.first);
        }

        lLockHandles.clear();

        // Refresh the disk properties
        DeviceIoControl(hdev, IOCTL_DISK_UPDATE_PROPERTIES, nullptr, 0, nullptr, 0, &dwRet, nullptr);
    }
#endif
}